

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

double __thiscall presolve::HPresolve::problemSizeReduction(HPresolve *this)

{
  double *pdVar1;
  long *in_RDI;
  double rowReduction;
  double colReduction;
  double local_18;
  double local_10 [2];
  
  local_10[0] = ((double)((int)in_RDI[0xc5] - (*(int *)*in_RDI - *(int *)((long)in_RDI + 0x624))) *
                100.0) / (double)(int)in_RDI[0xc5];
  local_18 = ((double)(*(int *)((long)in_RDI + 0x62c) - (*(int *)(*in_RDI + 4) - (int)in_RDI[0xc4]))
             * 100.0) / (double)*(int *)((long)in_RDI + 0x62c);
  pdVar1 = std::max<double>(&local_18,local_10);
  return *pdVar1;
}

Assistant:

double HPresolve::problemSizeReduction() {
  double colReduction =
      100.0 *
      static_cast<double>(oldNumCol - (model->num_col_ - numDeletedCols)) /
      oldNumCol;
  double rowReduction =
      100.0 *
      static_cast<double>(oldNumRow - (model->num_row_ - numDeletedRows)) /
      oldNumRow;

  return std::max(rowReduction, colReduction);
}